

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::MapReflectionTester::SwapMapsViaReflection
          (MapReflectionTester *this,Message *message)

{
  byte bVar1;
  pointer ppFVar2;
  Nonnull<const_char_*> failure_msg;
  pointer ppFVar3;
  bool v1;
  ulong uVar4;
  Metadata MVar5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  output;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  LogMessageFatal local_28;
  
  MVar5 = Message::GetMetadata(message);
  local_48.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(MVar5.reflection,message,&local_48);
  ppFVar3 = local_48.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    ppFVar2 = local_48.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar1 = ppFVar3[uVar4]->field_0x1;
      v1 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 != v1) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (v1,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_28,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
      }
      if ((bVar1 & 0x20) != 0) {
        Reflection::SwapElements(MVar5.reflection,message,ppFVar3[uVar4],0,1);
        ppFVar2 = local_48.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppFVar3 = local_48.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppFVar2 - (long)ppFVar3 >> 3));
  }
  if (ppFVar3 != (pointer)0x0) {
    operator_delete(ppFVar3,(long)local_48.
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar3
                   );
  }
  return;
}

Assistant:

void MapReflectionTester::SwapMapsViaReflection(Message* message) {
  const Reflection* reflection = message->GetReflection();
  std::vector<const FieldDescriptor*> output;
  reflection->ListFields(*message, &output);
  for (int i = 0; i < output.size(); ++i) {
    const FieldDescriptor* field = output[i];
    if (!field->is_repeated()) continue;
    reflection->SwapElements(message, field, 0, 1);
  }
}